

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,string *address_string,AddressFormatData *network_parameter)

{
  initializer_list<cfd::core::AddressFormatData> __l;
  AddressFormatData *local_108;
  string local_b8;
  allocator<cfd::core::AddressFormatData> local_91;
  AddressFormatData *local_90;
  AddressFormatData local_88;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> params;
  AddressFormatData *network_parameter_local;
  string *address_string_local;
  Address *this_local;
  
  this->type_ = kCfdSuccess;
  this->addr_type_ = kP2shAddress;
  this->witness_ver_ = kVersionNone;
  ::std::__cxx11::string::string((string *)&this->address_,(string *)address_string);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  local_90 = &local_88;
  AddressFormatData::AddressFormatData(local_90,network_parameter);
  local_58 = &local_88;
  local_50 = 1;
  ::std::allocator<cfd::core::AddressFormatData>::allocator(&local_91);
  __l._M_len = local_50;
  __l._M_array = local_58;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_48,__l,&local_91);
  ::std::allocator<cfd::core::AddressFormatData>::~allocator(&local_91);
  local_108 = (AddressFormatData *)&local_58;
  do {
    local_108 = local_108 + -1;
    AddressFormatData::~AddressFormatData(local_108);
  } while (local_108 != &local_88);
  ::std::__cxx11::string::string((string *)&local_b8,(string *)address_string);
  DecodeAddress(this,&local_b8,
                (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)local_48);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
          local_48);
  return;
}

Assistant:

Address::Address(
    const std::string& address_string,
    const AddressFormatData& network_parameter)
    : type_(kMainnet),
      addr_type_(kP2shAddress),
      witness_ver_(kVersionNone),
      address_(address_string),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  const std::vector<AddressFormatData> params = {network_parameter};
  DecodeAddress(address_string, &params);
}